

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O0

bool __thiscall SF_XORDecode::setDecodeParms(SF_XORDecode *this,QPDFObjectHandle *decode_parms)

{
  long lVar1;
  uchar *puVar2;
  exception *e;
  allocator<char> local_61;
  string local_60 [32];
  QPDFObjectHandle local_40;
  undefined1 local_30 [8];
  shared_ptr<Buffer> buf;
  QPDFObjectHandle *decode_parms_local;
  SF_XORDecode *this_local;
  
  buf.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)decode_parms;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"/KeyStream",&local_61);
  QPDFObjectHandle::getKey((string *)&local_40);
  QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)local_30);
  QPDFObjectHandle::~QPDFObjectHandle(&local_40);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_30);
  lVar1 = Buffer::getSize();
  if (lVar1 == 1) {
    std::__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)local_30);
    puVar2 = (uchar *)Buffer::getBuffer();
    this->key = *puVar2;
  }
  std::shared_ptr<Buffer>::~shared_ptr((shared_ptr<Buffer> *)local_30);
  return lVar1 == 1;
}

Assistant:

bool
SF_XORDecode::setDecodeParms(QPDFObjectHandle decode_parms)
{
    // For purposes of example, we store the key in a separate stream. We could just as well store
    // the key directly in /DecodeParms, but this example uses a stream to illustrate how one might
    // do that. For example, if implementing /JBIG2Decode, one would need to handle the
    // /JBIG2Globals key, which points to a stream. See comments in SF_XORDecode::registerStream for
    // additional notes on this.
    try {
        // Expect /DecodeParms to be a dictionary with a /KeyStream key that points to a one-byte
        // stream whose single byte is the key. If we are successful at retrieving the key, return
        // true, indicating that we are able to process with the given decode parameters. Under any
        // other circumstances, return false. For other examples of QPDFStreamFilter
        // implementations, look at the classes whose names start with SF_ in the qpdf library
        // implementation.
        auto buf = decode_parms.getKey("/KeyStream").getStreamData();
        if (buf->getSize() != 1) {
            return false;
        }
        this->key = buf->getBuffer()[0];
        return true;
    } catch (std::exception& e) {
        std::cerr << "Error extracting key for /XORDecode: " << e.what() << std::endl;
    }
    return false;
}